

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::SceneRender(SceneRender *this)

{
  vec<3,_float,_(glm::qualifier)0> local_28 [2];
  SceneRender *local_10;
  SceneRender *this_local;
  
  this->_vptr_SceneRender = (_func_int **)&PTR__SceneRender_0076b7a8;
  this->showGrid = false;
  this->showAxis = false;
  this->showBBoxes = false;
  this->showCubebox = false;
  local_10 = this;
  vera::Fbo::Fbo(&this->renderFbo);
  vera::Fbo::Fbo(&this->normalFbo);
  vera::Fbo::Fbo(&this->positionFbo);
  std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::vector(&this->buffersFbo);
  this->dynamicShadows = false;
  vera::Node::Node(&this->m_origin);
  this->m_blend = BLEND_ALPHA;
  this->m_culling = CULL_NONE;
  this->m_depth_test = true;
  std::unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>>::
  unique_ptr<std::default_delete<vera::Vbo>,void>
            ((unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>> *)&this->m_lightUI_vbo);
  vera::Shader::Shader(&this->m_lightUI_shader);
  this->m_shadows = false;
  vera::Shader::Shader(&this->m_background_shader);
  this->m_background = false;
  vera::Shader::Shader(&this->m_cubemap_shader);
  std::unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>>::
  unique_ptr<std::default_delete<vera::Vbo>,void>
            ((unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>> *)&this->m_cubemap_vbo);
  vera::Model::Model(&this->m_floor);
  this->m_floor_height = 0.0;
  this->m_floor_subd_target = -1;
  this->m_floor_subd = -1;
  std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::vector(&this->m_devlook_spheres);
  std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::vector(&this->m_devlook_billboards);
  std::unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>>::
  unique_ptr<std::default_delete<vera::Vbo>,void>
            ((unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>> *)&this->m_grid_vbo);
  std::unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>>::
  unique_ptr<std::default_delete<vera::Vbo>,void>
            ((unique_ptr<vera::Vbo,std::default_delete<vera::Vbo>> *)&this->m_axis_vbo);
  this->m_buffers_total = 0;
  this->m_commands_loaded = false;
  this->m_uniforms_loaded = false;
  glm::vec<3,_float,_(glm::qualifier)0>::vec(local_28,0.0);
  vera::Node::setPosition(&this->m_origin,local_28);
  return;
}

Assistant:

SceneRender::SceneRender(): 
    // Debug State
    showGrid(false), showAxis(false), showBBoxes(false), showCubebox(false), 
    // Camera.
    m_blend(vera::BLEND_ALPHA), m_culling(vera::CULL_NONE), m_depth_test(true),
    // Light
    dynamicShadows(false), m_shadows(false),
    // Background
    m_background(false), 
    // Floor
    m_floor_height(0.0), m_floor_subd_target(-1), m_floor_subd(-1),

    m_buffers_total(0), m_commands_loaded(false), m_uniforms_loaded(false)
    {
    m_origin.setPosition(glm::vec3(0.0));
}